

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.h
# Opt level: O0

void __thiscall
iDynTree::ArticulatedBodyAlgorithmInternalBuffers::ArticulatedBodyAlgorithmInternalBuffers
          (ArticulatedBodyAlgorithmInternalBuffers *this)

{
  long in_RDI;
  LinkArticulatedBodyInertias *this_00;
  size_t nrOfLinks;
  size_t in_stack_ffffffffffffff98;
  JointDOFsDoubleArray *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  DOFSpatialForceArray *in_stack_ffffffffffffffb0;
  
  DOFSpatialMotionArray::DOFSpatialMotionArray
            ((DOFSpatialMotionArray *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  DOFSpatialForceArray::DOFSpatialForceArray(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  JointDOFsDoubleArray::JointDOFsDoubleArray(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  JointDOFsDoubleArray::JointDOFsDoubleArray(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (LinkArticulatedBodyInertias *)(in_RDI + 0x70);
  LinkVelArray::LinkVelArray((LinkVelArray *)this_00,in_stack_ffffffffffffffa8);
  nrOfLinks = in_RDI + 0x88;
  LinkAccArray::LinkAccArray((LinkAccArray *)this_00,nrOfLinks);
  LinkAccArray::LinkAccArray((LinkAccArray *)this_00,nrOfLinks);
  LinkArticulatedBodyInertias::LinkArticulatedBodyInertias(this_00,nrOfLinks);
  LinkWrenches::LinkWrenches((LinkWrenches *)this_00,nrOfLinks);
  return;
}

Assistant:

ArticulatedBodyAlgorithmInternalBuffers() {}